

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_strand.hpp
# Opt level: O2

return_type __thiscall
asio::io_context::strand::
dispatch<asio::detail::rewrapped_handler<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>,__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>,std::error_code,unsigned_long>,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>>>
          (strand *this,
          rewrapped_handler<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>_>,_std::error_code,_unsigned_long>,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>_>
          *handler)

{
  detail::strand_service::
  dispatch<asio::detail::rewrapped_handler<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>,__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>,std::error_code,unsigned_long>,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>>>
            (this->service_,&this->impl_,handler);
  return;
}

Assistant:

dispatch(ASIO_MOVE_ARG(LegacyCompletionHandler) handler)
  {
    // If you get an error on the following line it means that your handler does
    // not meet the documented type requirements for a LegacyCompletionHandler.
    ASIO_LEGACY_COMPLETION_HANDLER_CHECK(
        LegacyCompletionHandler, handler) type_check;

    async_completion<LegacyCompletionHandler, void ()> init(handler);

    service_.dispatch(impl_, init.completion_handler);

    return init.result.get();
  }